

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_reaction_diffusion_mri.c
# Opt level: O0

int main(void)

{
  int iVar1;
  FILE *pFVar2;
  double dVar3;
  double dVar4;
  SUNContext ctx;
  int iout;
  sunrealtype tout;
  sunrealtype t;
  FILE *UFID;
  FILE *FID;
  MRIStepInnerStepper inner_stepper;
  void *inner_arkode_mem;
  void *arkode_mem;
  N_Vector y;
  int retval;
  sunindextype i;
  sunrealtype ep;
  sunindextype N;
  sunrealtype L;
  sunrealtype *data;
  UserData udata;
  sunrealtype hf;
  sunrealtype hs;
  int Nt;
  sunrealtype dTout;
  sunrealtype Tf;
  sunrealtype T0;
  double in_stack_ffffffffffffff28;
  int opt;
  char *in_stack_ffffffffffffff30;
  void *in_stack_ffffffffffffff38;
  char *returnvalue;
  undefined8 local_c0;
  int local_b4;
  UserData in_stack_ffffffffffffff50;
  N_Vector in_stack_ffffffffffffff58;
  char *pcVar5;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  int local_6c;
  long local_68;
  double local_60;
  long local_58;
  double local_50;
  long local_48;
  long *local_40;
  undefined8 local_38;
  undefined8 local_30;
  int local_24;
  double local_20;
  double local_18;
  char *local_10;
  int local_4;
  
  local_4 = 0;
  local_10 = (char *)0x0;
  local_18 = 3.0;
  local_20 = 0.1;
  dVar3 = ceil(30.0);
  local_24 = (int)dVar3;
  local_30 = 0x3f50624dd2f1a9fc;
  local_38 = 0x3ef4f8b588e368f1;
  local_40 = (long *)0x0;
  local_50 = 5.0;
  local_58 = 0x3e9;
  local_60 = 0.01;
  local_78 = 0;
  local_80 = 0;
  local_88 = 0;
  local_90 = 0;
  local_6c = SUNContext_Create(0,&local_c0);
  opt = (int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  iVar1 = check_retval(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,opt);
  if (iVar1 == 0) {
    local_40 = (long *)malloc(0x20);
    *local_40 = local_58;
    local_40[1] = (long)(local_50 / ((double)local_58 + -1.0));
    local_40[2] = (long)(0.0001 / local_60);
    dVar3 = sqrt(local_60 * 2.0 * 10000.0);
    local_40[3] = (long)(dVar3 * 0.5);
    printf("\n1D reaction-diffusion PDE test problem:\n");
    printf("  N = %li\n",*local_40);
    printf("  diffusion coefficient:  k = %g\n",local_40[2]);
    local_78 = N_VNew_Serial(local_58,local_c0);
    iVar1 = check_retval(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,opt);
    if (iVar1 == 0) {
      local_6c = SetInitialCondition(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      iVar1 = check_retval(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,opt);
      if (iVar1 == 0) {
        local_88 = ARKStepCreate(local_10,ff,0,local_78,local_c0);
        iVar1 = check_retval(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,opt);
        if (iVar1 == 0) {
          local_6c = ARKodeSetUserData(local_88,local_40);
          iVar1 = check_retval(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,opt);
          if (iVar1 == 0) {
            local_6c = ARKStepSetTableNum(local_88,0xffffffff,0xc);
            iVar1 = check_retval(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,opt);
            if (iVar1 == 0) {
              local_6c = ARKodeSetFixedStep(local_38,local_88);
              iVar1 = check_retval(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,opt);
              if (iVar1 == 0) {
                local_6c = ARKStepCreateMRIStepInnerStepper(local_88,&local_90);
                iVar1 = check_retval(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,opt);
                if (iVar1 == 0) {
                  local_80 = MRIStepCreate(local_10,fs,0,local_78,local_90,local_c0);
                  iVar1 = check_retval(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,opt);
                  if (iVar1 == 0) {
                    local_6c = ARKodeSetUserData(local_80,local_40);
                    iVar1 = check_retval(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,opt);
                    if (iVar1 == 0) {
                      local_6c = ARKodeSetFixedStep(local_30,local_80);
                      iVar1 = check_retval(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,opt);
                      if (iVar1 == 0) {
                        local_6c = ARKodeSetMaxNumSteps(local_80,10000);
                        iVar1 = check_retval(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,opt
                                            );
                        if (iVar1 == 0) {
                          pFVar2 = fopen("heat_mesh.txt","w");
                          for (local_68 = 0; local_68 < local_58; local_68 = local_68 + 1) {
                            fprintf(pFVar2,"  %.16e\n",(double)local_40[1] * (double)local_68);
                          }
                          fclose(pFVar2);
                          pFVar2 = fopen("heat1D.txt","w");
                          local_48 = N_VGetArrayPointer(local_78);
                          for (local_68 = 0; local_68 < local_58; local_68 = local_68 + 1) {
                            fprintf(pFVar2," %.16e",*(undefined8 *)(local_48 + local_68 * 8));
                          }
                          fprintf(pFVar2,"\n");
                          local_20 = (local_18 - (double)local_10) / (double)local_24;
                          dVar3 = (double)local_10 + local_20;
                          returnvalue = local_10;
                          printf("        t      ||u||_rms\n");
                          printf("   -------------------------\n");
                          pcVar5 = returnvalue;
                          dVar4 = (double)N_VDotProd(local_78,local_78);
                          dVar4 = sqrt(dVar4 / (double)local_58);
                          printf("  %10.6f  %10.6f\n",returnvalue,dVar4);
                          for (local_b4 = 0; local_b4 < local_24; local_b4 = local_b4 + 1) {
                            local_6c = ARKodeEvolve(dVar3,local_80,local_78,&stack0xffffffffffffff58
                                                    ,1);
                            iVar1 = check_retval(returnvalue,in_stack_ffffffffffffff30,
                                                 (int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
                            in_stack_ffffffffffffff30 = pcVar5;
                            if (iVar1 != 0) break;
                            pcVar5 = in_stack_ffffffffffffff30;
                            dVar4 = (double)N_VDotProd(local_78,local_78);
                            dVar4 = sqrt(dVar4 / (double)local_58);
                            printf("  %10.6f  %10.6f\n",in_stack_ffffffffffffff30,dVar4);
                            for (local_68 = 0; local_68 < local_58; local_68 = local_68 + 1) {
                              fprintf(pFVar2," %.16e",*(undefined8 *)(local_48 + local_68 * 8));
                            }
                            fprintf(pFVar2,"\n");
                            in_stack_ffffffffffffff28 = local_20 + dVar3;
                            if (local_18 < in_stack_ffffffffffffff28) {
                              in_stack_ffffffffffffff28 = local_18;
                            }
                            dVar3 = in_stack_ffffffffffffff28;
                          }
                          printf("   -------------------------\n");
                          fclose(pFVar2);
                          printf("\nFinal Slow Statistics:\n");
                          local_6c = ARKodePrintAllStats(local_80,_stdout,0);
                          printf("\nFinal Fast Statistics:\n");
                          local_6c = ARKodePrintAllStats(local_88,_stdout,0);
                          pFVar2 = fopen("ark_reaction_diffusion_mri_slow_stats.csv","w");
                          local_6c = ARKodePrintAllStats(local_80,pFVar2,1);
                          fclose(pFVar2);
                          pFVar2 = fopen("ark_reaction_diffusion_mri_fast_stats.csv","w");
                          local_6c = ARKodePrintAllStats(local_88,pFVar2,1);
                          fclose(pFVar2);
                          N_VDestroy(local_78);
                          ARKodeFree(&local_88);
                          MRIStepInnerStepper_Free(&local_90);
                          ARKodeFree(&local_80);
                          free(local_40);
                          SUNContext_Free(&local_c0);
                          local_4 = 0;
                        }
                        else {
                          local_4 = 1;
                        }
                      }
                      else {
                        local_4 = 1;
                      }
                    }
                    else {
                      local_4 = 1;
                    }
                  }
                  else {
                    local_4 = 1;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(void)
{
  /* general problem parameters */
  sunrealtype T0    = SUN_RCONST(0.0);       /* initial time */
  sunrealtype Tf    = SUN_RCONST(3.0);       /* final time */
  sunrealtype dTout = SUN_RCONST(0.1);       /* time between outputs */
  int Nt            = (int)ceil(Tf / dTout); /* number of output times */
  sunrealtype hs    = SUN_RCONST(0.001);     /* slow step size */
  sunrealtype hf    = SUN_RCONST(0.00002);   /* fast step size */
  UserData udata    = NULL;                  /* user data */

  sunrealtype* data;                /* array for solution output */
  sunrealtype L  = SUN_RCONST(5.0); /* domain length */
  sunindextype N = 1001;            /* number of mesh points */
  sunrealtype ep = SUN_RCONST(1e-2);
  sunindextype i;

  /* general problem variables */
  int retval;                    /* reusable error-checking flag */
  N_Vector y             = NULL; /* empty vector for storing solution */
  void* arkode_mem       = NULL; /* empty ARKode memory structure */
  void* inner_arkode_mem = NULL; /* empty ARKode memory structure */
  MRIStepInnerStepper inner_stepper = NULL; /* inner stepper */
  FILE *FID, *UFID;
  sunrealtype t, tout;
  int iout;

  /* Create the SUNDIALS context object for this simulation */
  SUNContext ctx;
  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /*
   * Initialization
   */

  /* allocate and fill user data structure */
  udata      = (UserData)malloc(sizeof(*udata));
  udata->N   = N;
  udata->dx  = L / (SUN_RCONST(1.0) * N - SUN_RCONST(1.0));
  udata->k   = SUN_RCONST(1e-4) / ep;
  udata->lam = SUN_RCONST(0.5) * sqrt(SUN_RCONST(2.0) * ep * SUN_RCONST(1e4));

  /* Initial problem output */
  printf("\n1D reaction-diffusion PDE test problem:\n");
  printf("  N = %li\n", (long int)udata->N);
  printf("  diffusion coefficient:  k = %" GSYM "\n", udata->k);

  /* Create and initialize serial vector for the solution */
  y = N_VNew_Serial(N, ctx);
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return 1; }

  retval = SetInitialCondition(y, udata);
  if (check_retval(&retval, "SetInitialCondition", 1)) { return 1; }

  /*
   * Create the slow integrator and set options
   */

  /* Initialize the fast integrator. Specify the explicit fast right-hand side
     function in y'=fe(t,y)+fi(t,y)+ff(t,y), the inital time T0, and the
     initial dependent variable vector y. */
  inner_arkode_mem = ARKStepCreate(ff, NULL, T0, y, ctx);
  if (check_retval((void*)inner_arkode_mem, "ARKStepCreate", 0)) { return 1; }

  /* Attach user data to fast integrator */
  retval = ARKodeSetUserData(inner_arkode_mem, (void*)udata);
  if (check_retval(&retval, "ARKodeSetUserData", 1)) { return 1; }

  /* Set the fast method */
  retval = ARKStepSetTableNum(inner_arkode_mem, -1, ARKODE_KNOTH_WOLKE_3_3);
  if (check_retval(&retval, "ARKStepSetTableNum", 1)) { return 1; }

  /* Set the fast step size */
  retval = ARKodeSetFixedStep(inner_arkode_mem, hf);
  if (check_retval(&retval, "ARKodeSetFixedStep", 1)) { return 1; }

  /* Create inner stepper */
  retval = ARKStepCreateMRIStepInnerStepper(inner_arkode_mem, &inner_stepper);
  if (check_retval(&retval, "ARKStepCreateMRIStepInnerStepper", 1))
  {
    return 1;
  }

  /*
   * Create the slow integrator and set options
   */

  /* Initialize the slow integrator. Specify the explicit slow right-hand side
     function in y'=fe(t,y)+fi(t,y)+ff(t,y), the inital time T0, the
     initial dependent variable vector y, and the fast integrator. */
  arkode_mem = MRIStepCreate(fs, NULL, T0, y, inner_stepper, ctx);
  if (check_retval((void*)arkode_mem, "MRIStepCreate", 0)) { return 1; }

  /* Pass udata to user functions */
  retval = ARKodeSetUserData(arkode_mem, (void*)udata);
  if (check_retval(&retval, "ARKodeSetUserData", 1)) { return 1; }

  /* Set the slow step size */
  retval = ARKodeSetFixedStep(arkode_mem, hs);
  if (check_retval(&retval, "ARKodeSetFixedStep", 1)) { return 1; }

  /* Increase max num steps  */
  retval = ARKodeSetMaxNumSteps(arkode_mem, 10000);
  if (check_retval(&retval, "ARKodeSetMaxNumSteps", 1)) { return 1; }

  /*
   * Integrate ODE
   */

  /* output mesh to disk */
  FID = fopen("heat_mesh.txt", "w");
  for (i = 0; i < N; i++) { fprintf(FID, "  %.16" ESYM "\n", udata->dx * i); }
  fclose(FID);

  /* Open output stream for results, access data array */
  UFID = fopen("heat1D.txt", "w");
  data = N_VGetArrayPointer(y);

  /* output initial condition to disk */
  for (i = 0; i < N; i++) { fprintf(UFID, " %.16" ESYM "", data[i]); }
  fprintf(UFID, "\n");

  /* Main time-stepping loop: calls ARKodeEvolve to perform the integration, then
     prints results. Stops when the final time has been reached */
  t     = T0;
  dTout = (Tf - T0) / Nt;
  tout  = T0 + dTout;
  printf("        t      ||u||_rms\n");
  printf("   -------------------------\n");
  printf("  %10.6" FSYM "  %10.6f\n", t, sqrt(N_VDotProd(y, y) / N));
  for (iout = 0; iout < Nt; iout++)
  {
    /* call integrator */
    retval = ARKodeEvolve(arkode_mem, tout, y, &t, ARK_NORMAL);
    if (check_retval(&retval, "ARKodeEvolve", 1)) { break; }

    /* print solution stats and output results to disk */
    printf("  %10.6" FSYM "  %10.6f\n", t, sqrt(N_VDotProd(y, y) / N));
    for (i = 0; i < N; i++) { fprintf(UFID, " %.16" ESYM "", data[i]); }
    fprintf(UFID, "\n");

    /* successful solve: update output time */
    tout += dTout;
    tout = (tout > Tf) ? Tf : tout;
  }
  printf("   -------------------------\n");
  fclose(UFID);

  /* Print final statistics to the screen */
  printf("\nFinal Slow Statistics:\n");
  retval = ARKodePrintAllStats(arkode_mem, stdout, SUN_OUTPUTFORMAT_TABLE);
  printf("\nFinal Fast Statistics:\n");
  retval = ARKodePrintAllStats(inner_arkode_mem, stdout, SUN_OUTPUTFORMAT_TABLE);

  /* Print final statistics to a file in CSV format */
  FID    = fopen("ark_reaction_diffusion_mri_slow_stats.csv", "w");
  retval = ARKodePrintAllStats(arkode_mem, FID, SUN_OUTPUTFORMAT_CSV);
  fclose(FID);
  FID    = fopen("ark_reaction_diffusion_mri_fast_stats.csv", "w");
  retval = ARKodePrintAllStats(inner_arkode_mem, FID, SUN_OUTPUTFORMAT_CSV);
  fclose(FID);

  /* Clean up and return */
  N_VDestroy(y);                            /* Free y vector */
  ARKodeFree(&inner_arkode_mem);            /* Free integrator memory */
  MRIStepInnerStepper_Free(&inner_stepper); /* Free inner stepper */
  ARKodeFree(&arkode_mem);                  /* Free integrator memory */
  free(udata);                              /* Free user data */
  SUNContext_Free(&ctx);                    /* Free context */

  return 0;
}